

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O3

bool __thiscall CNetAddr::IsRFC5737(CNetAddr *this)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long in_FS_OFFSET;
  bool bVar4;
  bool bVar5;
  char local_11 [9];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_net == NET_IPV4) {
    local_11[6] = -0x40;
    local_11[7] = '\0';
    local_11[8] = 2;
    uVar1 = (this->m_addr)._size;
    uVar2 = uVar1 - 0x11;
    if (uVar1 < 0x11) {
      uVar2 = uVar1;
    }
    if (2 < uVar2) {
      if (0x10 < uVar1) {
        this = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
      }
      lVar3 = 0;
      do {
        if (local_11[lVar3 + 6] != (this->m_addr)._union.direct[lVar3]) {
          local_11[3] = -0x3a;
          local_11[4] = '3';
          local_11[5] = 100;
          lVar3 = 0;
          goto LAB_00d73dcb;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      goto LAB_00d73ddd;
    }
  }
  bVar4 = false;
  goto LAB_00d73da8;
  while (bVar5 = lVar3 != 2, lVar3 = lVar3 + 1, bVar5) {
LAB_00d73def:
    bVar4 = local_11[lVar3] == (this->m_addr)._union.direct[lVar3];
    if (!bVar4) break;
  }
  goto LAB_00d73da8;
  while (lVar3 = lVar3 + 1, lVar3 != 3) {
LAB_00d73dcb:
    if (local_11[lVar3 + 3] != (this->m_addr)._union.direct[lVar3]) {
      local_11[0] = -0x35;
      local_11[1] = '\0';
      local_11[2] = 0x71;
      lVar3 = 0;
      goto LAB_00d73def;
    }
  }
LAB_00d73ddd:
  bVar4 = true;
LAB_00d73da8:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool CNetAddr::IsRFC5737() const
{
    return IsIPv4() && (HasPrefix(m_addr, std::array<uint8_t, 3>{192, 0, 2}) ||
                        HasPrefix(m_addr, std::array<uint8_t, 3>{198, 51, 100}) ||
                        HasPrefix(m_addr, std::array<uint8_t, 3>{203, 0, 113}));
}